

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O1

void __thiscall GlobOpt::ProcessArrayValueKills(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  Type pBVar2;
  Opnd *this_00;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  uint uVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  undefined4 *puVar8;
  Type pJVar9;
  Type_conflict pBVar10;
  Type_conflict pBVar11;
  
  OVar1 = instr->m_opcode;
  uVar6 = (uint)OVar1;
  if (OVar1 < StSuperFld) {
    if ((uVar6 - 0x70 < 0x36) && ((0x3014000f0f0145U >> ((ulong)(uVar6 - 0x70) & 0x3f) & 1) != 0))
    goto LAB_0049f8a9;
LAB_0049fa68:
    bVar5 = IR::Instr::UsesAllFields(instr);
    if (!bVar5) {
      return;
    }
    pBVar7 = (this->currentBlock->globOptData).liveArrayValues;
    if (pBVar7->head == (Type_conflict)0x0) goto LAB_0049f8e2;
    pJVar9 = pBVar7->alloc;
    pBVar2 = pBVar7->head;
    pBVar10 = pJVar9->bvFreeList;
    do {
      pBVar11 = pBVar2;
      pBVar2 = pBVar11->next;
      pBVar11->next = pBVar10;
      pBVar10 = pBVar11;
    } while (pBVar2 != (Type)0x0);
  }
  else {
    if (OVar1 < StSlot) {
      if ((0xc < OVar1 - 0x127) || ((0x1805U >> (OVar1 - 0x127 & 0x1f) & 1) == 0)) {
        if (uVar6 != 0x1bb) goto LAB_0049fa68;
        if (instr->m_src1 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x350,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar5) goto LAB_0049fab3;
          *puVar8 = 0;
        }
        this_00 = instr->m_src1;
        OVar4 = IR::Opnd::GetKind(this_00);
        if (OVar4 != OpndKindHelperCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
          if (!bVar5) {
LAB_0049fab3:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        uVar6 = *(int *)&this_00[1]._vptr_Opnd - 0x18d;
        if (0x10 < uVar6) {
          return;
        }
        if ((0x1b001U >> (uVar6 & 0x1f) & 1) == 0) {
          return;
        }
        pBVar7 = (this->currentBlock->globOptData).liveArrayValues;
        if (pBVar7->head == (Type_conflict)0x0) goto LAB_0049f8e2;
        pJVar9 = pBVar7->alloc;
        pBVar2 = pBVar7->head;
        pBVar10 = pJVar9->bvFreeList;
        do {
          pBVar11 = pBVar2;
          pBVar2 = pBVar11->next;
          pBVar11->next = pBVar10;
          pBVar10 = pBVar11;
        } while (pBVar2 != (Type)0x0);
        goto LAB_0049f8db;
      }
    }
    else if (((0x35 < OVar1 - 0x1f7) ||
             ((0x20000000000083U >> ((ulong)(OVar1 - 0x1f7) & 0x3f) & 1) == 0)) &&
            (1 < uVar6 - 0x269)) goto LAB_0049fa68;
LAB_0049f8a9:
    pBVar7 = (this->currentBlock->globOptData).liveArrayValues;
    if (pBVar7->head == (Type_conflict)0x0) goto LAB_0049f8e2;
    pJVar9 = pBVar7->alloc;
    pBVar2 = pBVar7->head;
    pBVar10 = pJVar9->bvFreeList;
    do {
      pBVar11 = pBVar2;
      pBVar2 = pBVar11->next;
      pBVar11->next = pBVar10;
      pBVar10 = pBVar11;
    } while (pBVar2 != (Type)0x0);
  }
LAB_0049f8db:
  pJVar9->bvFreeList = pBVar11;
LAB_0049f8e2:
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->lastUsedNodePrevNextField = &pBVar7->head;
  return;
}

Assistant:

void
GlobOpt::ProcessArrayValueKills(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::ConsoleScopedStFld:
    case Js::OpCode::ConsoleScopedStFldStrict:
    case Js::OpCode::ScopedStFld:
    case Js::OpCode::ScopedStFldStrict:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
    case Js::OpCode::StArrViewElem:
    // These array helpers may change A.length (and A[i] could be A.length)...
    case Js::OpCode::InlineArrayPush:
    case Js::OpCode::InlineArrayPop:
        this->currentBlock->globOptData.liveArrayValues->ClearAll();
        break;

    case Js::OpCode::CallDirect:
        Assert(instr->GetSrc1());
        switch(instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper)
        {
            // These array helpers may change A[i]
            case IR::HelperArray_Reverse:
            case IR::HelperArray_Shift:
            case IR::HelperArray_Unshift:
            case IR::HelperArray_Splice:
            case IR::HelperArray_Concat:
                this->currentBlock->globOptData.liveArrayValues->ClearAll();
                break;
        }
        break;
    default:
        if (instr->UsesAllFields())
        {
            this->currentBlock->globOptData.liveArrayValues->ClearAll();
        }
        break;
    }
}